

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tx_search.c
# Opt level: O0

void choose_smallest_tx_size
               (AV1_COMP *cpi,MACROBLOCK *x,RD_STATS *rd_stats,int64_t ref_best_rd,BLOCK_SIZE bs)

{
  long in_RSI;
  int skip_trellis;
  MB_MODE_INFO *mbmi;
  MACROBLOCKD *xd;
  int64_t in_stack_00000068;
  RD_STATS *in_stack_00000070;
  AV1_COMP *in_stack_00000078;
  MACROBLOCK *in_stack_00000080;
  BLOCK_SIZE in_stack_00000090;
  TX_SIZE in_stack_00000098;
  FAST_TX_SEARCH_MODE in_stack_000000a0;
  int in_stack_000000a8;
  
  *(undefined1 *)(**(long **)(in_RSI + 0x2058) + 0x91) = 0;
  av1_txfm_rd_in_plane
            (in_stack_00000080,in_stack_00000078,in_stack_00000070,in_stack_00000068,(int64_t)cpi,
             x._4_4_,in_stack_00000090,in_stack_00000098,in_stack_000000a0,in_stack_000000a8);
  return;
}

Assistant:

static inline void choose_smallest_tx_size(const AV1_COMP *const cpi,
                                           MACROBLOCK *x, RD_STATS *rd_stats,
                                           int64_t ref_best_rd, BLOCK_SIZE bs) {
  MACROBLOCKD *const xd = &x->e_mbd;
  MB_MODE_INFO *const mbmi = xd->mi[0];

  mbmi->tx_size = TX_4X4;
  // TODO(any) : Pass this_rd based on skip/non-skip cost
  const int skip_trellis = 0;
  av1_txfm_rd_in_plane(x, cpi, rd_stats, ref_best_rd, 0, 0, bs, mbmi->tx_size,
                       FTXS_NONE, skip_trellis);
}